

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O0

int X509_supported_extension(X509_EXTENSION *ex)

{
  int iVar1;
  ASN1_OBJECT *o;
  undefined1 local_15;
  int nid;
  X509_EXTENSION *ex_local;
  
  o = X509_EXTENSION_get_object(ex);
  iVar1 = OBJ_obj2nid(o);
  local_15 = true;
  if (((((iVar1 != 0x53) && (local_15 = true, iVar1 != 0x55)) && (local_15 = true, iVar1 != 0x57))
      && ((local_15 = true, iVar1 != 0x59 && (local_15 = true, iVar1 != 0x7e)))) &&
     ((local_15 = true, iVar1 != 0x191 &&
      ((local_15 = true, iVar1 != 0x29a && (local_15 = true, iVar1 != 0x2eb)))))) {
    local_15 = iVar1 == 0x2ec;
  }
  return (int)local_15;
}

Assistant:

int X509_supported_extension(const X509_EXTENSION *ex) {
  int nid = OBJ_obj2nid(X509_EXTENSION_get_object(ex));
  return nid == NID_key_usage ||             //
         nid == NID_subject_alt_name ||      //
         nid == NID_basic_constraints ||     //
         nid == NID_certificate_policies ||  //
         nid == NID_ext_key_usage ||         //
         nid == NID_policy_constraints ||    //
         nid == NID_name_constraints ||      //
         nid == NID_policy_mappings ||       //
         nid == NID_inhibit_any_policy;
}